

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::makeSmallestNormalized(IEEEFloat *this,bool Negative)

{
  uint uVar1;
  uint uVar2;
  Significand *dst;
  Significand *pSVar3;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  uVar1 = this->semantics->precision;
  pSVar3 = &this->significand;
  dst = pSVar3;
  if (uVar1 - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  APInt::tcSet(&dst->part,0,uVar1 + 0x40 >> 6);
  this->field_0x12 = this->field_0x12 & 0xf7 | Negative << 3;
  this->exponent = this->semantics->minExponent;
  uVar2 = this->semantics->precision;
  uVar1 = uVar2 + 0x3f;
  if (uVar2 - 0x40 < 0xffffff80) {
    pSVar3 = (Significand *)(this->significand).parts;
  }
  pSVar3[(uVar1 >> 6) - 1].part = pSVar3[(uVar1 >> 6) - 1].part | 1L << ((byte)uVar1 & 0x3f);
  return;
}

Assistant:

void IEEEFloat::makeSmallestNormalized(bool Negative) {
  // We want (in interchange format):
  //   sign = {Negative}
  //   exponent = 0..0
  //   significand = 10..0

  category = fcNormal;
  zeroSignificand();
  sign = Negative;
  exponent = semantics->minExponent;
  significandParts()[partCountForBits(semantics->precision) - 1] |=
      (((integerPart)1) << ((semantics->precision - 1) % integerPartWidth));
}